

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticVersion.cpp
# Opt level: O2

bool beast::isNumeric(string *s)

{
  bool bVar1;
  __type _Var2;
  int n;
  int local_5c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_58,(string *)s);
  bVar1 = lexicalCastChecked<int,std::__cxx11::string>(&local_5c,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  if (bVar1) {
    std::__cxx11::to_string(&local_38,local_5c);
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_38,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)s);
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    _Var2 = false;
  }
  return _Var2;
}

Assistant:

bool isNumeric (std::string const& s)
{
    int n;

    // Must be convertible to an integer
    if (!lexicalCastChecked (n, s))
        return false;

    // Must not have leading zeroes
    return std::to_string (n) == s;
}